

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_tvp.c
# Opt level: O0

jas_tvparser_t * jas_tvparser_create(char *s)

{
  char *pcVar1;
  jas_tvparser_t *tvp;
  char *s_local;
  
  s_local = (char *)jas_malloc(0x20);
  if ((jas_tvparser_t *)s_local == (jas_tvparser_t *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    pcVar1 = jas_strdup(s);
    ((jas_tvparser_t *)s_local)->buf = pcVar1;
    if (pcVar1 == (char *)0x0) {
      jas_tvparser_destroy((jas_tvparser_t *)s_local);
      s_local = (char *)0x0;
    }
    else {
      ((jas_tvparser_t *)s_local)->pos = ((jas_tvparser_t *)s_local)->buf;
      ((jas_tvparser_t *)s_local)->tag = (char *)0x0;
      ((jas_tvparser_t *)s_local)->val = (char *)0x0;
    }
  }
  return (jas_tvparser_t *)s_local;
}

Assistant:

jas_tvparser_t *jas_tvparser_create(const char *s)
{
	jas_tvparser_t *tvp;
	if (!(tvp = jas_malloc(sizeof(jas_tvparser_t)))) {
		return 0;
	}
	if (!(tvp->buf = jas_strdup(s))) {
		jas_tvparser_destroy(tvp);
		return 0;
	}
	tvp->pos = tvp->buf;
	tvp->tag = 0;
	tvp->val = 0;
	return tvp;
}